

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_color_profile_init(LodePNGColorProfile *profile)

{
  LodePNGColorProfile *profile_local;
  
  profile->colored = 0;
  profile->key = 0;
  profile->alpha = 0;
  profile->key_b = 0;
  profile->key_g = 0;
  profile->key_r = 0;
  profile->numcolors = 0;
  profile->bits = 1;
  return;
}

Assistant:

void lodepng_color_profile_init(LodePNGColorProfile* profile)
{
  profile->colored = 0;
  profile->key = 0;
  profile->alpha = 0;
  profile->key_r = profile->key_g = profile->key_b = 0;
  profile->numcolors = 0;
  profile->bits = 1;
}